

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsStatus cleanBounds(HighsOptions *options,HighsLp *lp)

{
  double *pdVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  int iVar6;
  char *format;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar2 = lp->num_col_;
  if ((long)iVar2 < 1) {
    iVar6 = 0;
    dVar7 = 0.0;
  }
  else {
    pdVar3 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    iVar6 = 0;
    dVar7 = 0.0;
    do {
      dVar10 = pdVar3[uVar5];
      dVar9 = pdVar4[uVar5];
      dVar8 = dVar10 - dVar9;
      pdVar1 = &(options->super_HighsOptionsStruct).primal_feasibility_tolerance;
      if (*pdVar1 <= dVar8 && dVar8 != *pdVar1) {
        format = "Column %d has inconsistent bounds [%g, %g] (residual = %g) after presolve\n";
        goto LAB_0023ef35;
      }
      if (0.0 < dVar8) {
        iVar6 = iVar6 + 1;
        if (dVar7 <= dVar8) {
          dVar7 = dVar8;
        }
        dVar9 = (dVar10 + dVar9) * 0.5;
        pdVar3[uVar5] = dVar9;
        pdVar4[uVar5] = dVar9;
      }
      uVar5 = uVar5 + 1;
    } while ((long)iVar2 != uVar5);
  }
  iVar2 = lp->num_row_;
  if (0 < (long)iVar2) {
    pdVar3 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      dVar10 = pdVar3[uVar5];
      dVar9 = pdVar4[uVar5];
      dVar8 = dVar10 - dVar9;
      pdVar1 = &(options->super_HighsOptionsStruct).primal_feasibility_tolerance;
      if (*pdVar1 <= dVar8 && dVar8 != *pdVar1) {
        format = "Row %d has inconsistent bounds [%g, %g] (residual = %g) after presolve\n";
LAB_0023ef35:
        highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,format,dVar10,
                     uVar5 & 0xffffffff);
        return kError;
      }
      if (0.0 < dVar8) {
        iVar6 = iVar6 + 1;
        if (dVar7 <= dVar8) {
          dVar7 = dVar8;
        }
        dVar9 = (dVar10 + dVar9) * 0.5;
        pdVar3[uVar5] = dVar9;
        pdVar4[uVar5] = dVar9;
      }
      uVar5 = uVar5 + 1;
    } while ((long)iVar2 != uVar5);
  }
  if (iVar6 != 0) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,
                 "Resolved %d inconsistent bounds (maximum residual = %9.4g) after presolve\n");
  }
  return (uint)(iVar6 != 0);
}

Assistant:

HighsStatus cleanBounds(const HighsOptions& options, HighsLp& lp) {
  double max_residual = 0;
  HighsInt num_change = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double residual = lp.col_lower_[iCol] - lp.col_upper_[iCol];
    if (residual > options.primal_feasibility_tolerance) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Column %" HIGHSINT_FORMAT
                   " has inconsistent bounds [%g, %g] (residual = "
                   "%g) after presolve\n",
                   iCol, lp.col_lower_[iCol], lp.col_upper_[iCol], residual);
      return HighsStatus::kError;
    } else if (residual > 0) {
      num_change++;
      max_residual = std::max(residual, max_residual);
      double mid = 0.5 * (lp.col_lower_[iCol] + lp.col_upper_[iCol]);
      lp.col_lower_[iCol] = mid;
      lp.col_upper_[iCol] = mid;
    }
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double residual = lp.row_lower_[iRow] - lp.row_upper_[iRow];
    if (residual > options.primal_feasibility_tolerance) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Row %" HIGHSINT_FORMAT
                   " has inconsistent bounds [%g, %g] (residual = %g) "
                   "after presolve\n",
                   iRow, lp.row_lower_[iRow], lp.row_upper_[iRow], residual);
      return HighsStatus::kError;
    } else if (residual > 0) {
      num_change++;
      max_residual = std::max(residual, max_residual);
      double mid = 0.5 * (lp.row_lower_[iRow] + lp.row_upper_[iRow]);
      lp.row_lower_[iRow] = mid;
      lp.row_upper_[iRow] = mid;
    }
  }
  if (num_change) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Resolved %" HIGHSINT_FORMAT
                 " inconsistent bounds (maximum residual = "
                 "%9.4g) after presolve\n",
                 num_change, max_residual);
    return HighsStatus::kWarning;
  }
  return HighsStatus::kOk;
}